

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcMappedItem::IfcMappedItem(IfcMappedItem *this)

{
  *(undefined ***)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).field_0x20 =
       &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x38 = 0;
  *(char **)&this->field_0x40 = "IfcMappedItem";
  IfcRepresentationItem::IfcRepresentationItem
            ((IfcRepresentationItem *)this,&PTR_construction_vtable_24__007a5ac0);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7a5a58;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).field_0x20
       = 0x7a5aa8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x7a5a80;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).field_0x10
       = 0;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).field_0x18
       = 0;
  return;
}

Assistant:

IfcMappedItem() : Object("IfcMappedItem") {}